

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int xmlDictOwns(xmlDictPtr dict,xmlChar *str)

{
  xmlDictStringsPtr_conflict local_28;
  xmlDictStringsPtr_conflict pool;
  xmlChar *str_local;
  xmlDictPtr dict_local;
  
  if ((dict == (xmlDictPtr)0x0) || (str == (xmlChar *)0x0)) {
    dict_local._4_4_ = -1;
  }
  else {
    for (local_28 = dict->strings; local_28 != (xmlDictStringsPtr_conflict)0x0;
        local_28 = local_28->next) {
      if ((local_28->array <= str) && (str <= local_28->free)) {
        return 1;
      }
    }
    if (dict->subdict == (_xmlDict *)0x0) {
      dict_local._4_4_ = 0;
    }
    else {
      dict_local._4_4_ = xmlDictOwns(dict->subdict,str);
    }
  }
  return dict_local._4_4_;
}

Assistant:

int
xmlDictOwns(xmlDictPtr dict, const xmlChar *str) {
    xmlDictStringsPtr pool;

    if ((dict == NULL) || (str == NULL))
	return(-1);
    pool = dict->strings;
    while (pool != NULL) {
        if ((str >= &pool->array[0]) && (str <= pool->free))
	    return(1);
	pool = pool->next;
    }
    if (dict->subdict)
        return(xmlDictOwns(dict->subdict, str));
    return(0);
}